

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApa.c
# Opt level: O0

int Cudd_ApaPrintDecimal(FILE *fp,int digits,DdApaNumber number)

{
  bool bVar1;
  bool bVar2;
  DdApaDigit DVar3;
  DdApaDigit DVar4;
  int iVar5;
  DdApaNumber dest;
  void *__ptr;
  double dVar6;
  int decimalDigits;
  int leadingzero;
  uchar *decimal;
  DdApaNumber work;
  DdApaDigit remainder;
  int result;
  int i;
  DdApaNumber number_local;
  int digits_local;
  FILE *fp_local;
  
  dVar6 = log10(4294967296.0);
  DVar3 = (DdApaDigit)((double)digits * dVar6);
  dest = Cudd_NewApaNumber(digits);
  if (dest == (DdApaNumber)0x0) {
    fp_local._4_4_ = 0;
  }
  else {
    __ptr = malloc((long)(int)(DVar3 + 1));
    if (__ptr == (void *)0x0) {
      if (dest != (DdApaNumber)0x0) {
        free(dest);
      }
      fp_local._4_4_ = 0;
    }
    else {
      Cudd_ApaCopy(digits,number,dest);
      for (remainder = DVar3; -1 < (int)remainder; remainder = remainder - 1) {
        DVar4 = Cudd_ApaShortDivision(digits,dest,10,dest);
        *(char *)((long)__ptr + (long)(int)remainder) = (char)DVar4;
      }
      if (dest != (DdApaNumber)0x0) {
        free(dest);
      }
      bVar1 = true;
      for (remainder = 0; (int)remainder < (int)(DVar3 + 1); remainder = remainder + 1) {
        bVar2 = false;
        if (bVar1) {
          bVar2 = *(char *)((long)__ptr + (long)(int)remainder) == '\0';
        }
        bVar1 = bVar2;
        if (((!bVar1) || (remainder == DVar3)) &&
           (iVar5 = fprintf((FILE *)fp,"%1d",(ulong)*(byte *)((long)__ptr + (long)(int)remainder)),
           iVar5 == -1)) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
          return 0;
        }
      }
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      fp_local._4_4_ = 1;
    }
  }
  return fp_local._4_4_;
}

Assistant:

int
Cudd_ApaPrintDecimal(
  FILE * fp,
  int  digits,
  DdApaNumber  number)
{
    int i, result;
    DdApaDigit remainder;
    DdApaNumber work;
    unsigned char *decimal;
    int leadingzero;
    int decimalDigits = (int) (digits * log10((double) DD_APA_BASE)) + 1;

    work = Cudd_NewApaNumber(digits);
    if (work == NULL)
        return(0);
    decimal = ABC_ALLOC(unsigned char, decimalDigits);
    if (decimal == NULL) {
        ABC_FREE(work);
        return(0);
    }
    Cudd_ApaCopy(digits,number,work);
    for (i = decimalDigits - 1; i >= 0; i--) {
        remainder = Cudd_ApaShortDivision(digits,work,(DdApaDigit) 10,work);
        decimal[i] = (unsigned char) remainder;
    }
    ABC_FREE(work);

    leadingzero = 1;
    for (i = 0; i < decimalDigits; i++) {
        leadingzero = leadingzero && (decimal[i] == 0);
        if ((!leadingzero) || (i == (decimalDigits - 1))) {
            result = fprintf(fp,"%1d",decimal[i]);
            if (result == EOF) {
                ABC_FREE(decimal);
                return(0);
            }
        }
    }
    ABC_FREE(decimal);
    return(1);

}